

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O2

void __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::CloneAnnotationForVariable
          (InterfaceVariableScalarReplacement *this,Instruction *annotation_inst,uint32_t var_id)

{
  Op OVar1;
  Instruction *this_00;
  initializer_list<unsigned_int> init_list;
  uint32_t local_5c;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_58;
  SmallVector<unsigned_int,_2UL> local_50;
  
  OVar1 = annotation_inst->opcode_;
  if (((OVar1 != OpDecorate) && (OVar1 != OpDecorateId)) && (OVar1 != OpDecorateString)) {
    __assert_fail("annotation_inst->opcode() == spv::Op::OpDecorate || annotation_inst->opcode() == spv::Op::OpDecorateId || annotation_inst->opcode() == spv::Op::OpDecorateString"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/interface_var_sroa.cpp"
                  ,0x227,
                  "void spvtools::opt::InterfaceVariableScalarReplacement::CloneAnnotationForVariable(Instruction *, uint32_t)"
                 );
  }
  this_00 = Instruction::Clone(annotation_inst,(this->super_Pass).context_);
  init_list._M_len = 1;
  init_list._M_array = &local_5c;
  local_5c = var_id;
  local_58._M_head_impl = this_00;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_50,init_list);
  Instruction::SetInOperand(this_00,0,&local_50);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_50);
  IRContext::AddAnnotationInst
            ((this->super_Pass).context_,
             (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              *)&local_58);
  if (local_58._M_head_impl != (Instruction *)0x0) {
    (*((local_58._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
      _vptr_IntrusiveNodeBase[1])();
  }
  return;
}

Assistant:

void InterfaceVariableScalarReplacement::CloneAnnotationForVariable(
    Instruction* annotation_inst, uint32_t var_id) {
  assert(annotation_inst->opcode() == spv::Op::OpDecorate ||
         annotation_inst->opcode() == spv::Op::OpDecorateId ||
         annotation_inst->opcode() == spv::Op::OpDecorateString);
  std::unique_ptr<Instruction> new_inst(annotation_inst->Clone(context()));
  new_inst->SetInOperand(0, {var_id});
  context()->AddAnnotationInst(std::move(new_inst));
}